

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              size_t ilen,uchar *input,uchar *output)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = ctx->len;
  if ((uVar1 < ilen + 0xb || 0xfffffffffffffff4 < ilen) ||
     (*output = '\0', f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) {
    return -0x4080;
  }
  lVar6 = uVar1 - ilen;
  puVar5 = output + 2;
  output[1] = '\x02';
  if (lVar6 != 3) {
    lVar6 = lVar6 + -4;
    do {
      iVar3 = 100;
      do {
        iVar2 = (*f_rng)(p_rng,puVar5,1);
        iVar4 = iVar3;
        if ((*puVar5 != '\0') || (iVar4 = iVar3 + -1, iVar3 == 1)) break;
        iVar3 = iVar4;
      } while (iVar2 == 0);
      if ((iVar2 != 0) || (iVar4 == 0)) {
        return iVar2 + -0x4480;
      }
      puVar5 = puVar5 + 1;
      bVar7 = lVar6 != 0;
      lVar6 = lVar6 + -1;
    } while (bVar7);
  }
  *puVar5 = '\0';
  if (ilen != 0) {
    switchD_012b9b0d::default(puVar5 + 1,input,ilen);
  }
  iVar3 = mbedtls_rsa_public(ctx,output,output);
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt(mbedtls_rsa_context *ctx,
                                        int (*f_rng)(void *, unsigned char *, size_t),
                                        void *p_rng, size_t ilen,
                                        const unsigned char *input,
                                        unsigned char *output)
{
    size_t nb_pad, olen;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = output;

    olen = ctx->len;

    /* first comparison checks for overflow */
    if (ilen + 11 < ilen || olen < ilen + 11) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    nb_pad = olen - 3 - ilen;

    *p++ = 0;

    if (f_rng == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    *p++ = MBEDTLS_RSA_CRYPT;

    while (nb_pad-- > 0) {
        int rng_dl = 100;

        do {
            ret = f_rng(p_rng, p, 1);
        } while (*p == 0 && --rng_dl && ret == 0);

        /* Check if RNG failed to generate data */
        if (rng_dl == 0 || ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_RNG_FAILED, ret);
        }

        p++;
    }

    *p++ = 0;
    if (ilen != 0) {
        memcpy(p, input, ilen);
    }

    return mbedtls_rsa_public(ctx, output, output);
}